

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_parameter<int,_2,_trng::yarn2> *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  int (*in_RSI) [2];
  wistream *in_RDI;
  int i;
  fmtflags flags;
  mrg_parameter<int,_2,_trng::yarn2> P_new;
  delim_c *in_stack_ffffffffffffffb8;
  wistream *d;
  wistream *in_stack_ffffffffffffffc0;
  int local_24;
  mrg_parameter<int,_2,_trng::yarn2> local_18;
  int (*local_10) [2];
  wistream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_2,_trng::yarn2>::mrg_parameter(&local_18);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    std::wistream::operator>>(local_8,local_18.a + local_24);
    if (local_24 + 1 < 2) {
      in_stack_ffffffffffffffc0 = local_8;
      utility::delim('\0');
      utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  d = local_8;
  utility::delim('\0');
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                      in_stack_ffffffffffffffc0,(delim_c *)d);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *local_10 = local_18.a;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }